

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialManager.cpp
# Opt level: O0

void __thiscall MT32Emu::PartialManager::partialDeactivated(PartialManager *this,int partialIndex)

{
  Partial *this_00;
  Synth *this_01;
  bool bVar1;
  Bit32u BVar2;
  uint uVar3;
  Partial *partial;
  Bit32u i;
  int partialIndex_local;
  PartialManager *this_local;
  
  uVar3 = this->inactivePartialCount;
  BVar2 = Synth::getPartialCount(this->synth);
  if (uVar3 < BVar2) {
    uVar3 = this->inactivePartialCount;
    this->inactivePartialCount = uVar3 + 1;
    this->inactivePartials[uVar3] = partialIndex;
  }
  else {
    Synth::printDebug(this->synth,
                      "PartialManager Error: Cannot return deactivated partial %d, current partial state:\n"
                      ,(ulong)(uint)partialIndex);
    partial._0_4_ = 0;
    while( true ) {
      BVar2 = Synth::getPartialCount(this->synth);
      if (BVar2 <= (uint)partial) break;
      this_00 = this->partialTable[(uint)partial];
      this_01 = this->synth;
      bVar1 = Partial::isActive(this_00);
      uVar3 = Partial::getOwnerPart(this_00);
      Synth::printDebug(this_01,"[Partial %d]: activation=%d, owner part=%d\n",(ulong)(uint)partial,
                        (ulong)bVar1,(ulong)uVar3);
      partial._0_4_ = (uint)partial + 1;
    }
  }
  return;
}

Assistant:

void PartialManager::partialDeactivated(int partialIndex) {
	if (inactivePartialCount < synth->getPartialCount()) {
		inactivePartials[inactivePartialCount++] = partialIndex;
		return;
	}
	synth->printDebug("PartialManager Error: Cannot return deactivated partial %d, current partial state:\n", partialIndex);
	for (Bit32u i = 0; i < synth->getPartialCount(); i++) {
		const Partial *partial = partialTable[i];
		synth->printDebug("[Partial %d]: activation=%d, owner part=%d\n", i, partial->isActive(), partial->getOwnerPart());
	}
}